

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction.cc
# Opt level: O0

bool __thiscall
sptk::AperiodicityExtraction::Run
          (AperiodicityExtraction *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  undefined8 in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  vector<double,_std::allocator<double>_> length_fixed_f0;
  int given_f0_length;
  int target_f0_length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  undefined1 local_49 [25];
  int local_30;
  int local_2c;
  undefined8 local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = IsValid((AperiodicityExtraction *)
                  CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (bVar1) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
    auVar6._8_4_ = (int)(sVar3 >> 0x20);
    auVar6._0_8_ = sVar3;
    auVar6._12_4_ = 0x45300000;
    iVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x10))();
    dVar5 = ceil(((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) / (double)iVar2);
    local_2c = (int)dVar5;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_20);
    local_30 = (int)sVar3;
    if (local_2c == local_30) {
      local_1 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))
                          (*(long **)(in_RDI + 8),local_18,local_20,local_28);
      local_1 = local_1 & 1;
    }
    else {
      __last._M_current = (double *)(long)local_2c;
      __first._M_current = (double *)local_49;
      std::allocator<double>::allocator((allocator<double> *)0x1093dc);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)__last._M_current,
                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::allocator<double>::~allocator((allocator<double> *)0x109402);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      _Var4._M_current = (double *)std::min<int>(&local_2c,&local_30);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+(in_stack_ffffffffffffff28,
                CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      _Var4 = std::
              copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (__first,__last,_Var4);
      if ((0 < local_30) && (local_30 < local_2c)) {
        __last_00._M_current = (double *)(local_49 + 1);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                  __last_00._M_current,CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20)
                 );
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
        std::vector<double,_std::allocator<double>_>::back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (_Var4,__last_00,
                   (double *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      }
      local_1 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))
                          (*(long **)(in_RDI + 8),local_18,local_49 + 1,local_28);
      local_1 = local_1 & 1;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)_Var4._M_current);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool AperiodicityExtraction::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  if (!IsValid()) {
    return false;
  }

  const int target_f0_length(
      static_cast<int>(std::ceil(static_cast<double>(waveform.size()) /
                                 aperiodicity_extraction_->GetFrameShift())));
  const int given_f0_length(static_cast<int>(f0.size()));
  if (target_f0_length == given_f0_length) {
    return aperiodicity_extraction_->Run(waveform, f0, aperiodicity);
  }

  std::vector<double> length_fixed_f0(target_f0_length);
  std::copy(f0.begin(),
            f0.begin() + std::min(target_f0_length, given_f0_length),
            length_fixed_f0.begin());
  if (1 <= given_f0_length && given_f0_length < target_f0_length) {
    std::fill(length_fixed_f0.begin() + given_f0_length, length_fixed_f0.end(),
              f0.back());
  }
  return aperiodicity_extraction_->Run(waveform, length_fixed_f0, aperiodicity);
}